

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O0

void print_log(char *func,int line_num,char *templ,__va_list_tag *va)

{
  char local_828 [8];
  char output [2048];
  __va_list_tag *va_local;
  char *templ_local;
  int line_num_local;
  char *func_local;
  
  output._2040_8_ = va;
  snprintf(local_828,0x800,"%s:%d %s\n",func,(ulong)(uint)line_num,templ);
  output[0x7f7] = '\0';
  vfprintf(_stderr,local_828,(__gnuc_va_list)output._2040_8_);
  fflush(_stderr);
  return;
}

Assistant:

static void print_log(const char *func, int line_num, const char *templ, va_list va)
{
    char output[2048];

    /* create the output string template */
    snprintf(output, sizeof(output),"%s:%d %s\n", func, line_num, templ);

    /* make sure it is zero terminated */
    output[sizeof(output)-1] = 0;

    /* print it out. */
    vfprintf(stderr, output, va);

    fflush(stderr);
}